

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::all2all<unsigned_long>(unsigned_long *msgs,size_t size,unsigned_long *out,comm *comm)

{
  datatype dt;
  datatype local_20;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::all2all_big<unsigned_long>(msgs,size,out,comm);
    return;
  }
  local_20._vptr_datatype = (_func_int **)&PTR__datatype_0015b1e8;
  local_20.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_20.builtin = true;
  MPI_Alltoall();
  datatype::~datatype(&local_20);
  return;
}

Assistant:

void all2all(const T* msgs, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        impl::all2all_big(msgs, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Alltoall(const_cast<T*>(msgs), size, dt.type(), out, size, dt.type(), comm);
    }
}